

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.h
# Opt level: O2

bool __thiscall
mjs::gc_heap::type_check<mjs::gc_vector<mjs::activation_object::param>>(gc_heap *this,uint32_t pos)

{
  slot *psVar1;
  
  psVar1 = allocation_context::get_at(&this->alloc_context_,pos - 1);
  return gc_type_info_registration<mjs::gc_vector<mjs::activation_object::param>>::reg._40_4_ ==
         (psVar1->allocation).type;
}

Assistant:

bool type_check(uint32_t pos) const {
        const auto a = get_at(pos-1)->allocation;
        if constexpr (std::is_convertible_v<T*, object*>) {
            // Avoid creating gc_type_info_registration<T>'s for interface types
            return a.type_info().is_convertible_to_object() && dynamic_cast<T*>(reinterpret_cast<object*>(get_at(pos)));
        } else {
            return gc_type_info_registration<T>::index()  == a.type;
        }
    }